

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message-test.c++
# Opt level: O2

void __thiscall
capnp::_::anon_unknown_0::TestInitMessageBuilder::~TestInitMessageBuilder
          (TestInitMessageBuilder *this)

{
  ~TestInitMessageBuilder(this);
  operator_delete(this,0xe0);
  return;
}

Assistant:

TestInitMessageBuilder(kj::ArrayPtr<SegmentInit> segments): MessageBuilder(segments) {}